

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RaiseScope(cmMakefile *this,string *var,char *varDef)

{
  bool bVar1;
  ulong uVar2;
  Internals *this_00;
  ostream *poVar3;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream m;
  char *varDef_local;
  string *var_local;
  cmMakefile *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
    bVar1 = Internals::RaiseScope(this_00,var,varDef,this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar3 = std::operator<<((ostream *)local_198,"Cannot set \"");
      poVar3 = std::operator<<(poVar3,(string *)var);
      std::operator<<(poVar3,"\": current scope has no parent.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
  }
  return;
}

Assistant:

void cmMakefile::RaiseScope(const std::string& var, const char *varDef)
{
  if (var.empty())
    {
    return;
    }

  if (!this->Internal->RaiseScope(var, varDef, this))
    {
    std::ostringstream m;
    m << "Cannot set \"" << var << "\": current scope has no parent.";
    this->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    }
}